

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutosvg.c
# Opt level: O0

size_t hashmap_hash(char *data,size_t length)

{
  undefined8 local_28;
  size_t i;
  size_t h;
  size_t length_local;
  char *data_local;
  
  i = length;
  length_local = (size_t)data;
  for (local_28 = 0; local_28 < length; local_28 = local_28 + 1) {
    i = i * 0x1f + (long)*(char *)length_local;
    length_local = length_local + 1;
  }
  return i;
}

Assistant:

static size_t hashmap_hash(const char* data, size_t length)
{
    size_t h = length;
    for(size_t i = 0; i < length; i++) {
        h = h * 31 + *data;
        ++data;
    }

    return h;
}